

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void slang::uintToStrImpl<unsigned_int>(SmallVectorBase<char> *buffer,char *format,uint value)

{
  int iVar1;
  size_type index;
  reference __s;
  uint in_EDX;
  char *in_RSI;
  SmallVectorBase<char> *in_RDI;
  size_t offset;
  size_t sz;
  size_type in_stack_ffffffffffffffc8;
  SmallVectorBase<char> *this;
  
  iVar1 = snprintf((char *)0x0,0,in_RSI,(ulong)in_EDX);
  index = SmallVectorBase<char>::size(in_RDI);
  this = in_RDI;
  SmallVectorBase<char>::size(in_RDI);
  SmallVectorBase<char>::resize(this,in_stack_ffffffffffffffc8);
  __s = SmallVectorBase<char>::operator[](in_RDI,index);
  snprintf(__s,(long)iVar1 + 1,in_RSI,(ulong)in_EDX);
  SmallVectorBase<char>::pop_back(this);
  return;
}

Assistant:

void uintToStrImpl(SmallVectorBase<char>& buffer, const char* format, T value) {
    size_t sz = (size_t)snprintf(nullptr, 0, format, value);
    size_t offset = buffer.size();
    buffer.resize(buffer.size() + sz + 1);

    snprintf(&buffer[offset], sz + 1, format, value);
    buffer.pop_back();
}